

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O0

void __thiscall
indk::Neuron::doCreateNewSynapseCluster
          (Neuron *this,vector<float,_std::allocator<float>_> *PosVector,uint R,float k1,int64_t Tl,
          int NT)

{
  float fVar1;
  float fVar2;
  initializer_list<float> __l;
  reference EName;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  allocator<float> local_9d;
  float local_9c;
  float local_98;
  undefined4 local_94;
  iterator local_90;
  size_type local_88;
  vector<float,_std::allocator<float>_> local_80;
  reference local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  *ne;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  *__range1;
  float yr;
  float xr;
  float fi;
  float dfi;
  float y;
  float x;
  int NT_local;
  int64_t Tl_local;
  float k1_local;
  uint R_local;
  vector<float,_std::allocator<float>_> *PosVector_local;
  Neuron *this_local;
  
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](PosVector,0);
  fVar1 = *pvVar4;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](PosVector,1);
  fVar2 = *pvVar4;
  sVar5 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
          ::size(&this->Entries);
  auVar8._8_4_ = (int)(sVar5 >> 0x20);
  auVar8._0_8_ = sVar5;
  auVar8._12_4_ = 0x45300000;
  yr = 0.0;
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ::begin(&this->Entries);
  ne = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
          ::end(&this->Entries);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>_>
                                *)&ne);
    if (!bVar3) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>_>
               ::operator*(&__end1);
    dVar6 = cos((double)(yr / 180.0) * 3.141592653589793);
    dVar7 = sin((double)(yr / 180.0) * 3.141592653589793);
    EName = local_68;
    local_98 = (float)((double)R * dVar7 + (double)fVar2);
    local_94 = 0;
    local_90 = &local_9c;
    local_88 = 3;
    local_9c = (float)((double)R * dVar6 + (double)fVar1);
    std::allocator<float>::allocator(&local_9d);
    __l._M_len = local_88;
    __l._M_array = local_90;
    std::vector<float,_std::allocator<float>_>::vector(&local_80,__l,&local_9d);
    doCreateNewSynapse(this,&EName->first,&local_80,k1,Tl,NT);
    std::vector<float,_std::allocator<float>_>::~vector(&local_80);
    std::allocator<float>::~allocator(&local_9d);
    yr = (float)(360.0 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) + yr;
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapseCluster(const std::vector<float>& PosVector, unsigned R, float k1, int64_t Tl, int NT) {
    float x = PosVector[0];
    float y = PosVector[1];

    float dfi = 360. / Entries.size();
    float fi = 0;
    float xr, yr;
    for (auto &ne: Entries) {
        xr = x + R * cos(fi/180*M_PI);
        yr = y + R * sin(fi/180*M_PI);
        doCreateNewSynapse(ne.first, {xr, yr, 0}, k1, Tl, NT);
        fi += dfi;
    }
}